

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

void htmlAutoClose(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  int iVar1;
  endElementSAXFunc p_Var2;
  void *pvVar3;
  xmlChar *pxVar4;
  xmlChar *local_38;
  xmlChar *local_30;
  
  if ((newtag != (xmlChar *)0x0) && ((ctxt->options & 2U) == 0)) {
    local_38 = ctxt->name;
    while ((local_38 != (xmlChar *)0x0 &&
           (local_30 = newtag,
           pvVar3 = bsearch(&local_38,htmlStartClose,0xf9,0x10,htmlCompareStartClose),
           pvVar3 != (void *)0x0))) {
      htmlParserFinishElementParsing(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var2 = ctxt->sax->endElement, p_Var2 != (endElementSAXFunc)0x0)) {
        (*p_Var2)(ctxt->userData,ctxt->name);
      }
      iVar1 = ctxt->nameNr;
      if (0 < (long)iVar1) {
        ctxt->nameNr = iVar1 - 1U;
        if (iVar1 == 1) {
          pxVar4 = (xmlChar *)0x0;
        }
        else {
          pxVar4 = ctxt->nameTab[(long)iVar1 + -2];
        }
        ctxt->name = pxVar4;
        ctxt->nameTab[iVar1 - 1U] = (xmlChar *)0x0;
      }
      local_38 = ctxt->name;
    }
  }
  return;
}

Assistant:

static void
htmlAutoClose(htmlParserCtxtPtr ctxt, const xmlChar * newtag)
{
    if (ctxt->options & HTML_PARSE_HTML5)
        return;

    if (newtag == NULL)
        return;

    while ((ctxt->name != NULL) &&
           (htmlCheckAutoClose(newtag, ctxt->name))) {
	htmlParserFinishElementParsing(ctxt);
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}